

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O0

_Bool al_register_sample_saver(char *ext,_func__Bool_char_ptr_ALLEGRO_SAMPLE_ptr *saver)

{
  size_t sVar1;
  ACODEC_TABLE *pAVar2;
  _func__Bool_char_ptr_ALLEGRO_SAMPLE_ptr *in_RSI;
  char *in_RDI;
  ACODEC_TABLE *ent;
  _Bool local_1;
  
  sVar1 = strlen(in_RDI);
  if (sVar1 + 1 < 0x20) {
    pAVar2 = find_acodec_table_entry((char *)in_RSI);
    if (in_RSI == (_func__Bool_char_ptr_ALLEGRO_SAMPLE_ptr *)0x0) {
      if ((pAVar2 == (ACODEC_TABLE *)0x0) ||
         (pAVar2->saver == (_func__Bool_char_ptr_ALLEGRO_SAMPLE_ptr *)0x0)) {
        return false;
      }
    }
    else if (pAVar2 == (ACODEC_TABLE *)0x0) {
      pAVar2 = add_acodec_table_entry((char *)0x0);
    }
    pAVar2->saver = in_RSI;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool al_register_sample_saver(const char *ext,
   bool (*saver)(const char *filename, ALLEGRO_SAMPLE *spl))
{
   ACODEC_TABLE *ent;

   if (strlen(ext) + 1 >= MAX_EXTENSION_LENGTH) {
      return false;
   }

   ent = find_acodec_table_entry(ext);
   if (!saver) {
      if (!ent || !ent->saver) {
         return false; /* Nothing to remove. */
      }
   }
   else if (!ent) {
      ent = add_acodec_table_entry(ext);
   }

   ent->saver = saver;

   return true;
}